

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

void nni_list_insert_before(nni_list *list,void *item,void *before)

{
  long *plVar1;
  size_t sVar2;
  
  sVar2 = list->ll_offset;
  plVar1 = (long *)((long)item + sVar2);
  if ((*(long *)((long)item + sVar2) != 0) || (plVar1[1] != 0)) {
    nni_panic("inserting node already on a list or not inited");
  }
  *plVar1 = (long)before + sVar2;
  plVar1[1] = *(long *)((long)before + sVar2 + 8);
  *(long **)((long)before + sVar2 + 8) = plVar1;
  *(long **)plVar1[1] = plVar1;
  return;
}

Assistant:

void
nni_list_insert_before(nni_list *list, void *item, void *before)
{
	nni_list_node *node  = NODE(list, item);
	nni_list_node *where = NODE(list, before);

	if ((node->ln_next != NULL) || (node->ln_prev != NULL)) {
		nni_panic("inserting node already on a list or not inited");
	}
	node->ln_next          = where;
	node->ln_prev          = where->ln_prev;
	node->ln_next->ln_prev = node;
	node->ln_prev->ln_next = node;
}